

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::ShaderOperatorCase::~ShaderOperatorCase(ShaderOperatorCase *this)

{
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderOperatorCase_01e24290;
  deqp::gls::ShaderEvaluator::~ShaderEvaluator(&(this->m_evaluator).super_ShaderEvaluator);
  std::__cxx11::string::~string((string *)&this->m_shaderOp);
  deqp::gls::ShaderRenderCase::~ShaderRenderCase(&this->super_ShaderRenderCase);
  return;
}

Assistant:

ShaderOperatorCase::~ShaderOperatorCase (void)
{
}